

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

void PopHead<stCoCondItem_t,stCoCond_t>(stCoCond_t *apLink)

{
  stCoCondItem_t *psVar1;
  stCoCondItem_t *lp;
  stCoCond_t *apLink_local;
  
  if (apLink->head != (stCoCondItem_t *)0x0) {
    psVar1 = apLink->head;
    if (apLink->head == apLink->tail) {
      apLink->tail = (stCoCondItem_t *)0x0;
      apLink->head = (stCoCondItem_t *)0x0;
    }
    else {
      apLink->head = apLink->head->pNext;
    }
    psVar1->pNext = (stCoCondItem_t *)0x0;
    psVar1->pPrev = (stCoCondItem_t *)0x0;
    psVar1->pLink = (stCoCond_t *)0x0;
    if (apLink->head != (stCoCondItem_t *)0x0) {
      apLink->head->pPrev = (stCoCondItem_t *)0x0;
    }
  }
  return;
}

Assistant:

void inline PopHead( TLink*apLink )
{
	if( !apLink->head ) 
	{
		return ;
	}
	TNode *lp = apLink->head;
	if( apLink->head == apLink->tail )
	{
		apLink->head = apLink->tail = NULL;
	}
	else
	{
		apLink->head = apLink->head->pNext;
	}

	lp->pPrev = lp->pNext = NULL;
	lp->pLink = NULL;

	if( apLink->head )
	{
		apLink->head->pPrev = NULL;
	}
}